

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

void finish_pass_phuff(j_compress_ptr cinfo)

{
  long in_RDI;
  phuff_entropy_ptr entropy;
  phuff_entropy_ptr entropy_00;
  
  entropy_00 = *(phuff_entropy_ptr *)(in_RDI + 0x1f0);
  entropy_00->next_output_byte = (JOCTET *)**(undefined8 **)(in_RDI + 0x28);
  entropy_00->free_in_buffer = *(size_t *)(*(long *)(in_RDI + 0x28) + 8);
  emit_eobrun(entropy_00);
  flush_bits((phuff_entropy_ptr)0x139479);
  **(undefined8 **)(in_RDI + 0x28) = entropy_00->next_output_byte;
  *(size_t *)(*(long *)(in_RDI + 0x28) + 8) = entropy_00->free_in_buffer;
  return;
}

Assistant:

METHODDEF(void)
finish_pass_phuff(j_compress_ptr cinfo)
{
  phuff_entropy_ptr entropy = (phuff_entropy_ptr)cinfo->entropy;

  entropy->next_output_byte = cinfo->dest->next_output_byte;
  entropy->free_in_buffer = cinfo->dest->free_in_buffer;

  /* Flush out any buffered data */
  emit_eobrun(entropy);
  flush_bits(entropy);

  cinfo->dest->next_output_byte = entropy->next_output_byte;
  cinfo->dest->free_in_buffer = entropy->free_in_buffer;
}